

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *
fmt::v5::internal::
format_decimal<wchar_t,unsigned_int,fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,fmt::v5::internal::no_thousands_sep>
          (truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *param_1,
          undefined4 param_2,undefined4 param_3)

{
  truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> it;
  char *pcVar1;
  char *in_stack_00000010;
  char *in_stack_00000018;
  char *end;
  char_type buffer [13];
  undefined8 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffe0 [16];
  
  pcVar1 = format_decimal<unsigned_int,char,fmt::v5::internal::no_thousands_sep>
                     (&stack0xffffffffffffffe7,param_2,param_3);
  it.super_truncating_iterator_base<wchar_t_*>.limit_ = (size_t)pcVar1;
  it.super_truncating_iterator_base<wchar_t_*>.out_ = (wchar_t *)in_stack_ffffffffffffffd0;
  it.super_truncating_iterator_base<wchar_t_*>.count_ = in_stack_ffffffffffffffe0._0_8_;
  it.blackhole_ = in_stack_ffffffffffffffe0._8_4_;
  it._28_4_ = in_stack_ffffffffffffffe0._12_4_;
  copy_str<wchar_t,char*,fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>>
            (in_stack_00000018,in_stack_00000010,it);
  return param_1;
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}